

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene.cxx
# Opt level: O0

int __thiscall xray_re::b_params::init(b_params *this,EVP_PKEY_CTX *ctx)

{
  b_params *this_local;
  
  this->sm_angle = 75.0;
  this->weld_distance = 0.005;
  this->lm_rms_zero = 4;
  this->lm_rms = 4;
  this->lm_jitter_samples = 9;
  this->lm_pixels_per_meter = 10.0;
  this->convert_progressive = 0;
  this->pm_uv = 0.0;
  this->pm_pos = 0.0;
  this->pm_curv = 0.0;
  this->pm_border_h_angle = 0.0;
  this->pm_border_h_distance = 0.0;
  this->pm_heuristic = 0.0;
  return (int)this;
}

Assistant:

void b_params::init()
{
	sm_angle = 75.f;
	weld_distance = 0.005f;
	lm_rms_zero = 4;
	lm_rms = 4;
	lm_jitter_samples = 9;
	lm_pixels_per_meter = 10.0;

	convert_progressive = 0;
	pm_uv = 0;
	pm_pos = 0;
	pm_curv = 0;
	pm_border_h_angle = 0;
	pm_border_h_distance = 0;
	pm_heuristic = 0;
}